

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O0

void anon_unknown.dwarf_13ad8::fillChannels(Rand48 *random,DeepImageLevel *level)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string *psVar4;
  DeepImageChannel *pDVar5;
  DeepImageLevel *in_RSI;
  DeepImageLevel *in_RDI;
  Iterator i;
  DeepImageLevel *in_stack_ffffffffffffff98;
  DeepImageLevel *in_stack_ffffffffffffffa0;
  SampleCountChannel *in_stack_ffffffffffffffd8;
  Rand48 *in_stack_ffffffffffffffe0;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"             sample counts ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Imf_2_5::DeepImageLevel::sampleCounts(in_RSI);
  fillSampleCounts(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  Imf_2_5::DeepImageLevel::begin(in_stack_ffffffffffffff98);
  do {
    Imf_2_5::DeepImageLevel::ConstIterator::ConstIterator
              ((ConstIterator *)in_stack_ffffffffffffffa0,(Iterator *)in_stack_ffffffffffffff98);
    Imf_2_5::DeepImageLevel::end(in_stack_ffffffffffffff98);
    Imf_2_5::DeepImageLevel::ConstIterator::ConstIterator
              ((ConstIterator *)in_stack_ffffffffffffffa0,(Iterator *)in_stack_ffffffffffffff98);
    bVar1 = Imf_2_5::operator!=((ConstIterator *)in_stack_ffffffffffffffa0,
                                (ConstIterator *)in_stack_ffffffffffffff98);
    if (!bVar1) {
      return;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"             channel ");
    psVar4 = Imf_2_5::DeepImageLevel::Iterator::name_abi_cxx11_((Iterator *)0x11e07c);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pDVar5 = Imf_2_5::DeepImageLevel::Iterator::channel((Iterator *)0x11e0a2);
    iVar2 = (**(pDVar5->super_ImageChannel)._vptr_ImageChannel)();
    if (iVar2 == 0) {
      in_stack_ffffffffffffff98 = in_RDI;
      Imf_2_5::DeepImageLevel::Iterator::channel((Iterator *)0x11e128);
      fillChannel<unsigned_int>
                (in_stack_ffffffffffffffe0,(DeepImageChannel *)in_stack_ffffffffffffffd8);
    }
    else if (iVar2 == 1) {
      Imf_2_5::DeepImageLevel::Iterator::channel((Iterator *)0x11e0e3);
      fillChannel<half>(in_stack_ffffffffffffffe0,(DeepImageChannel *)in_stack_ffffffffffffffd8);
    }
    else {
      if (iVar2 != 2) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                      ,0x129,"void (anonymous namespace)::fillChannels(Rand48 &, DeepImageLevel &)")
        ;
      }
      in_stack_ffffffffffffffa0 = in_RDI;
      Imf_2_5::DeepImageLevel::Iterator::channel((Iterator *)0x11e106);
      fillChannel<float>(in_stack_ffffffffffffffe0,(DeepImageChannel *)in_stack_ffffffffffffffd8);
    }
    Imf_2_5::DeepImageLevel::Iterator::operator++((Iterator *)in_stack_ffffffffffffffa0);
  } while( true );
}

Assistant:

void
fillChannels (Rand48 &random, DeepImageLevel &level)
{
    cout << "             sample counts " << endl;
    fillSampleCounts (random, level.sampleCounts());

    for (DeepImageLevel::Iterator i = level.begin(); i != level.end(); ++i)
    {
        cout << "             channel " << i.name() << endl;

        switch (i.channel().pixelType())
        {
          case HALF:
            fillChannel <half> (random, i.channel());
            break;

          case FLOAT:
            fillChannel <float> (random, i.channel());
            break;

          case UINT:
            fillChannel <unsigned int> (random, i.channel());
            break;

          default:
             assert (false);
        }
    }
}